

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

void caffe::ReadSolverParamsFromTextFileOrDie(string *param_file,SolverParameter *param)

{
  pointer pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (param_file->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + param_file->_M_string_length);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (((param->_has_bits_).has_bits_[0] & 0x800000) != 0) {
    UpgradeSolverType(param);
  }
  return;
}

Assistant:

void ReadSolverParamsFromTextFileOrDie(const string& param_file,
                                       SolverParameter* param) {
  CHECK(ReadProtoFromTextFile(param_file, param))
      << "Failed to parse SolverParameter file: " << param_file;
  UpgradeSolverAsNeeded(param_file, param);
}